

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_&,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_&>
::streamReconstructedExpression
          (BinaryExpr<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_&,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  SmallVector<(anonymous_namespace)::Constructable,_2UL> *in_RDX;
  SmallVector<(anonymous_namespace)::Constructable,_2UL> *e;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  Detail::stringify<slang::SmallVector<(anonymous_namespace)::Constructable,2ul>>
            (&local_40,(Detail *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::stringify<slang::SmallVector<(anonymous_namespace)::Constructable,2ul>>
            (&local_60,(Detail *)this->m_rhs,e);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }